

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  int32_t iVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  id iVar5;
  int iVar6;
  int64_t iVar7;
  time_t tVar8;
  int64_t iVar9;
  int64_t iVar10;
  char *pcVar11;
  pointer piVar12;
  mapped_type *pmVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  pointer piVar18;
  initializer_list<int> __l;
  ulong local_1778;
  int local_1770;
  allocator<char> local_1769;
  vector<int,_std::allocator<int>_> embd_inp;
  int n_read;
  vector<int,_std::allocator<int>_> embd;
  vector<int,_std::allocator<int>_> last_n_tokens;
  long local_1718;
  long local_1710;
  size_t mem_per_token;
  float local_16f8;
  float local_16f4;
  float local_16f0;
  float local_16ec;
  vector<int,_std::allocator<int>_> response_inp;
  vector<int,_std::allocator<int>_> prompt_inp;
  vector<float,_std::allocator<float>_> logits;
  vector<int,_std::allocator<int>_> line_inp;
  gpt_params params;
  vector<int,_std::allocator<int>_> instruct_inp;
  string local_15d8;
  vector<int,_std::allocator<int>_> param_inp;
  gpt_vocab vocab;
  llama_model model;
  mt19937 rng;
  
  ggml_time_init();
  iVar7 = ggml_time_us();
  gpt_params::gpt_params(&params);
  bVar2 = gpt_params_parse(argc,argv,&params);
  if (bVar2) {
    if (params.seed < 0) {
      tVar8 = time((time_t *)0x0);
      params.seed = (int32_t)tVar8;
    }
    fprintf(_stderr,"%s: seed = %d\n","main");
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&rng,(long)params.seed);
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    llama_model::llama_model(&model);
    iVar9 = ggml_time_us();
    bVar2 = llama_model_load(&params.model,&model,&vocab,params.n_ctx);
    if (bVar2) {
      iVar10 = ggml_time_us();
      fputc(10,_stderr);
      iVar1 = params.n_threads;
      __stream = _stderr;
      uVar4 = std::thread::hardware_concurrency();
      pcVar11 = llama_print_system_info();
      fprintf(__stream,"system_info: n_threads = %d / %d | %s\n",(ulong)(uint)iVar1,(ulong)uVar4,
              pcVar11);
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&param_inp,
                 " Below is an instruction that describes a task. Write a response that appropriately completes the request.\n\n"
                 ,(allocator<char> *)&local_15d8);
      llama_tokenize(&instruct_inp,&vocab,(string *)&param_inp,true);
      std::__cxx11::string::~string((string *)&param_inp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&param_inp,"### Instruction:\n\n",(allocator<char> *)&local_15d8);
      llama_tokenize(&prompt_inp,&vocab,(string *)&param_inp,true);
      std::__cxx11::string::~string((string *)&param_inp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&param_inp,"### Response:\n\n",(allocator<char> *)&local_15d8);
      llama_tokenize(&response_inp,&vocab,(string *)&param_inp,false);
      std::__cxx11::string::~string((string *)&param_inp);
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)&embd_inp,
                 (const_iterator)
                 embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 instruct_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 instruct_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (params.prompt._M_string_length != 0) {
        llama_tokenize(&param_inp,&vocab,&params.prompt,true);
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&embd_inp,
                   (const_iterator)
                   embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   prompt_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   prompt_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&embd_inp,
                   (const_iterator)
                   embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&embd_inp,
                   (const_iterator)
                   embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   response_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   response_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&param_inp.super__Vector_base<int,_std::allocator<int>_>);
      }
      if (params.interactive == true) {
        param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)sigint_handler;
        sigemptyset((sigset_t *)
                    &param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        sigaction(2,(sigaction *)&param_inp,(sigaction *)0x0);
        fprintf(_stderr,"%s: interactive mode on.\n","main");
      }
      fprintf(_stderr,
              "sampling parameters: temp = %f, top_k = %d, top_p = %f, repeat_last_n = %i, repeat_penalty = %f\n"
              ,SUB84((double)params.temp,0),(double)params.top_p,(double)params.repeat_penalty,
              (ulong)(uint)params.top_k,(ulong)(uint)params.repeat_last_n);
      fwrite("\n\n",2,1,_stderr);
      iVar1 = params.n_threads;
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      mem_per_token = 0;
      local_15d8._M_dataplus._M_p = (pointer)0x100000000;
      local_15d8._M_string_length = 0x300000002;
      __l._M_len = 4;
      __l._M_array = (iterator)&local_15d8;
      std::vector<int,_std::allocator<int>_>::vector
                (&param_inp,__l,(allocator_type *)&last_n_tokens);
      llama_eval(&model,iVar1,0,&param_inp,&logits,&mem_per_token);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&param_inp.super__Vector_base<int,_std::allocator<int>_>);
      std::vector<int,_std::allocator<int>_>::vector
                (&last_n_tokens,(long)params.repeat_last_n,(allocator_type *)&param_inp);
      local_16f8 = (float)(iVar10 - iVar9);
      for (piVar12 = last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar12 !=
          last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish; piVar12 = piVar12 + 1) {
        *piVar12 = 0;
      }
      if (params.interactive == true) {
        fwrite("== Running in chat mode. ==\n - Press Ctrl+C to interject at any time.\n - Press Return to return control to LLaMA.\n - If you want to submit another line, end your input in \'\\\'.\n"
               ,0xb0,1,_stderr);
      }
      uVar14 = (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (params.interactive_start == true) {
        is_interacting = '\x01';
      }
      if (params.use_color == true) {
        printf("\x1b[33m");
      }
      iVar15 = model.hparams.n_ctx - (int)(uVar14 >> 2);
      bVar2 = true;
      local_1778 = 0;
      local_1710 = 0;
      local_1718 = 0;
      local_1770 = 0;
      while (iVar6 = 1, 0 < iVar15) {
        if (embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          iVar9 = ggml_time_us();
          bVar3 = llama_eval(&model,params.n_threads,local_1770,&embd,&logits,&mem_per_token);
          if (!bVar3) {
            fwrite("Failed to predict\n",0x12,1,_stderr);
            goto LAB_00109d3a;
          }
          iVar10 = ggml_time_us();
          local_1710 = (local_1710 - iVar9) + iVar10;
        }
        iVar1 = params.top_k;
        uVar14 = (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar14 != 0) {
          embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        uVar16 = (ulong)(int)local_1778;
        if ((uVar16 < (ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2)) ||
           (is_interacting != '\0')) {
          lVar17 = uVar16 * 4;
          do {
            if ((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) <= uVar16) break;
            std::vector<int,_std::allocator<int>_>::push_back
                      (&embd,(value_type_conflict2 *)
                             ((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar17));
            piVar12 = last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
            if (piVar12 !=
                last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              memmove(last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,piVar12,
                      (long)last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar12);
            }
            last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            std::vector<int,_std::allocator<int>_>::push_back
                      (&last_n_tokens,
                       (value_type_conflict2 *)
                       ((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar17));
            uVar16 = uVar16 + 1;
            lVar17 = lVar17 + 4;
          } while ((ulong)((long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2) <=
                   (ulong)(long)params.n_batch);
          if (!bVar2) {
            if ((params.use_color == true) &&
               ((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2 == (long)(int)uVar16)) {
              printf("\x1b[0m");
            }
            local_1778 = uVar16 & 0xffffffff;
            piVar18 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar12 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            goto LAB_0010993d;
          }
          local_1778 = uVar16 & 0xffffffff;
        }
        else {
          local_16ec = params.top_p;
          local_16f0 = params.temp;
          local_16f4 = params.repeat_penalty;
          lVar17 = (long)model.hparams.n_vocab;
          param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)((ulong)param_inp.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000)
          ;
          iVar9 = ggml_time_us();
          iVar5 = llama_sample_top_p_top_k
                            (&vocab,logits.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                    .super__Vector_impl_data._M_start +
                                    (((ulong)((long)logits.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                             (long)logits.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2) -
                                    lVar17),&last_n_tokens,(double)local_16f4,(int)(float)iVar1,
                             (double)local_16ec,(double)local_16f0,&rng);
          param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(param_inp.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
          piVar12 = last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
          if (piVar12 !=
              last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            memmove(last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,piVar12,
                    (long)last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar12);
          }
          last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          std::vector<int,_std::allocator<int>_>::push_back
                    (&last_n_tokens,(value_type_conflict2 *)&param_inp);
          iVar10 = ggml_time_us();
          std::vector<int,_std::allocator<int>_>::push_back
                    (&embd,(value_type_conflict2 *)&param_inp);
          local_1718 = (local_1718 - iVar9) + iVar10;
          iVar15 = iVar15 + -1;
          bVar2 = false;
          piVar18 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar12 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
LAB_0010993d:
          for (; piVar18 != piVar12; piVar18 = piVar18 + 1) {
            param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(param_inp.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,*piVar18);
            pmVar13 = std::
                      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&vocab.id_to_token,(key_type *)&param_inp);
            printf("%s",(pmVar13->_M_dataplus)._M_p);
          }
          fflush(_stdout);
        }
        if (params.interactive == true) {
          uVar16 = (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          if ((uVar16 <= (ulong)(long)(int)local_1778) && (is_interacting == '\x01')) {
            std::vector<int,std::allocator<int>>::
            insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)&embd_inp,
                       (const_iterator)
                       embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       prompt_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       prompt_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            printf("\n> ");
            bVar3 = true;
            while (bVar3) {
              fflush(_stdout);
              memset(&param_inp,0,0x100);
              if (params.use_color == true) {
                printf("\x1b[1m\x1b[32m");
              }
              iVar6 = __isoc99_scanf("%255[^\n]%n%*c",&param_inp,&n_read);
              if (iVar6 < 1) {
                __isoc99_scanf("%*c");
                n_read = 0;
              }
              if (params.use_color == true) {
                printf("\x1b[0m");
              }
              lVar17 = (long)n_read;
              if ((lVar17 < 1) ||
                 (*(char *)((long)&param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + (ulong)(n_read - 1)) != '\\'))
              {
                *(undefined1 *)
                 ((long)&param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar17) = 10;
                lVar17 = lVar17 + 1;
                bVar3 = false;
              }
              else {
                *(undefined1 *)
                 ((long)&param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (ulong)(n_read - 1)) = 10;
                bVar3 = true;
              }
              *(undefined1 *)
               ((long)&param_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_15d8,(char *)&param_inp,&local_1769);
              llama_tokenize(&line_inp,&vocab,&local_15d8,false);
              std::__cxx11::string::~string((string *)&local_15d8);
              std::vector<int,std::allocator<int>>::
              insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)&embd_inp,
                         (const_iterator)
                         embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         line_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         line_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::vector<int,std::allocator<int>>::
              insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)&embd_inp,
                         (const_iterator)
                         embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         response_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         response_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              iVar15 = iVar15 - ((int)((ulong)((long)response_inp.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_finish -
                                              (long)response_inp.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start) >> 2)
                                + (int)((ulong)((long)line_inp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                               (long)line_inp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2) +
                                  (int)((ulong)((long)prompt_inp.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                               (long)prompt_inp.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start) >> 2)
                                );
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&line_inp.super__Vector_base<int,_std::allocator<int>_>);
              bVar2 = true;
            }
            is_interacting = '\0';
            local_1778 = uVar16;
          }
        }
        local_1770 = local_1770 + (int)(uVar14 >> 2);
        if (embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish[-1] == 2) {
          if (params.interactive != true) {
            putchar(10);
            fwrite(" [end of text]\n",0xf,1,_stderr);
            break;
          }
          is_interacting = '\x01';
        }
      }
      iVar9 = ggml_time_us();
      fwrite("\n\n",2,1,_stderr);
      iVar6 = 0;
      fprintf(_stderr,"%s: mem per token = %8zu bytes\n","main",mem_per_token);
      fprintf(_stderr,"%s:     load time = %8.2f ms\n",SUB84((double)(local_16f8 / 1000.0),0),"main"
             );
      fprintf(_stderr,"%s:   sample time = %8.2f ms\n",SUB84((double)((float)local_1718 / 1000.0),0)
              ,"main");
      fprintf(_stderr,"%s:  predict time = %8.2f ms / %.2f ms per token\n",
              SUB84((double)((float)local_1710 / 1000.0),0),
              (double)(((float)local_1710 / 1000.0) / (float)local_1770),"main");
      fprintf(_stderr,"%s:    total time = %8.2f ms\n",
              SUB84((double)((float)(iVar9 - iVar7) / 1000.0),0),"main");
      ggml_free(model.ctx);
      if (params.use_color == true) {
        iVar6 = 0;
        printf("\x1b[0m");
      }
LAB_00109d3a:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&last_n_tokens.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&embd.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&response_inp.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&prompt_inp.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&instruct_inp.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&embd_inp.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&logits.super__Vector_base<float,_std::allocator<float>_>);
    }
    else {
      fprintf(_stderr,"%s: failed to load model from \'%s\'\n","main",params.model._M_dataplus._M_p)
      ;
      iVar6 = 1;
    }
    llama_model::~llama_model(&model);
    gpt_vocab::~gpt_vocab(&vocab);
  }
  else {
    iVar6 = 1;
  }
  gpt_params::~gpt_params(&params);
  return iVar6;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();
    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    fprintf(stderr, "%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    // if (params.prompt.empty()) {
    //     params.prompt = gpt_random_prompt(rng);
    // }

//    params.prompt = R"(// this function checks if the number n is prime
//bool is_prime(int n) {)";

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    llama_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();
        if (!llama_model_load(params.model, model, vocab, params.n_ctx)) {  
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;
    }

    // print system information
    {
        fprintf(stderr, "\n");
        fprintf(stderr, "system_info: n_threads = %d / %d | %s\n",
                params.n_threads, std::thread::hardware_concurrency(), llama_print_system_info());
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // Add a space in front of the first character to match OG llama tokenizer behavior
    // params.prompt.insert(0, 1, ' ');
    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp;

    // params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    // // tokenize the reverse prompt
    // std::vector<gpt_vocab::id> antiprompt_inp = ::llama_tokenize(vocab, params.antiprompt, false);


    std::vector<gpt_vocab::id> instruct_inp = ::llama_tokenize(vocab, " Below is an instruction that describes a task. Write a response that appropriately completes the request.\n\n", true);
    std::vector<gpt_vocab::id> prompt_inp = ::llama_tokenize(vocab, "### Instruction:\n\n", true);
    std::vector<gpt_vocab::id> response_inp = ::llama_tokenize(vocab, "### Response:\n\n", false);
    embd_inp.insert(embd_inp.end(), instruct_inp.begin(), instruct_inp.end());

    if(!params.prompt.empty()) {
        std::vector<gpt_vocab::id> param_inp = ::llama_tokenize(vocab, params.prompt, true);
        embd_inp.insert(embd_inp.end(), prompt_inp.begin(), prompt_inp.end());
        embd_inp.insert(embd_inp.end(), param_inp.begin(), param_inp.end());
        embd_inp.insert(embd_inp.end(), response_inp.begin(), response_inp.end());
    }

    // fprintf(stderr, "\n");
    // fprintf(stderr, "%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    // fprintf(stderr, "%s: number of tokens in prompt = %zu\n", __func__, embd_inp.size());
    // for (int i = 0; i < (int) embd_inp.size(); i++) {
    //     fprintf(stderr, "%6d -> '%s'\n", embd_inp[i], vocab.id_to_token.at(embd_inp[i]).c_str());
    // }
    // fprintf(stderr, "\n");

    if (params.interactive) {
#if defined (__unix__) || (defined (__APPLE__) && defined (__MACH__))
        struct sigaction sigint_action;
        sigint_action.sa_handler = sigint_handler;
        sigemptyset (&sigint_action.sa_mask);
        sigint_action.sa_flags = 0;
        sigaction(SIGINT, &sigint_action, NULL);
#elif defined (_WIN32)
        signal(SIGINT, sigint_handler);

        // Windows console ANSI color fix
        DWORD mode = 0;
        HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
        if (hConsole && hConsole != INVALID_HANDLE_VALUE && GetConsoleMode(hConsole, &mode)){
            SetConsoleMode(hConsole, mode | ENABLE_VIRTUAL_TERMINAL_PROCESSING);
            SetConsoleOutputCP(CP_UTF8);
        }
#endif

        fprintf(stderr, "%s: interactive mode on.\n", __func__);

        // if(antiprompt_inp.size()) {
        //     fprintf(stderr, "%s: reverse prompt: '%s'\n", __func__, params.antiprompt.c_str());
        //     fprintf(stderr, "%s: number of tokens in reverse prompt = %zu\n", __func__, antiprompt_inp.size());
        //     for (int i = 0; i < (int) antiprompt_inp.size(); i++) {
        //         fprintf(stderr, "%6d -> '%s'\n", antiprompt_inp[i], vocab.id_to_token.at(antiprompt_inp[i]).c_str());
        //     }
        //     fprintf(stderr, "\n");
        // }
    }
    fprintf(stderr, "sampling parameters: temp = %f, top_k = %d, top_p = %f, repeat_last_n = %i, repeat_penalty = %f\n", params.temp, params.top_k, params.top_p, params.repeat_last_n, params.repeat_penalty);
    fprintf(stderr, "\n\n");

    std::vector<gpt_vocab::id> embd;

    // determine the required inference memory per token:
    size_t mem_per_token = 0;
    llama_eval(model, params.n_threads, 0, { 0, 1, 2, 3 }, logits, mem_per_token);

    int last_n_size = params.repeat_last_n;
    std::vector<gpt_vocab::id> last_n_tokens(last_n_size);
    std::fill(last_n_tokens.begin(), last_n_tokens.end(), 0);


    if (params.interactive) {
        fprintf(stderr, "== Running in chat mode. ==\n"
#if defined (__unix__) || (defined (__APPLE__) && defined (__MACH__)) || defined (_WIN32)
               " - Press Ctrl+C to interject at any time.\n"
#endif
               " - Press Return to return control to LLaMA.\n"
               " - If you want to submit another line, end your input in '\\'.\n");
    }

    // we may want to slide the input window along with the context, but for now we restrict to the context length
    int remaining_tokens = model.hparams.n_ctx - embd_inp.size();
    int input_consumed = 0;
    bool input_noecho = true;

    // prompt user immediately after the starting prompt has been loaded
    if (params.interactive_start) {
        is_interacting = true;
    }

    // set the color for the prompt which will be output initially
    if (params.use_color) {
        printf(ANSI_COLOR_YELLOW);
    }

    

    while (remaining_tokens > 0) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!llama_eval(model, params.n_threads, n_past, embd, logits, mem_per_token)) {
                fprintf(stderr, "Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (embd_inp.size() <= input_consumed && !is_interacting) {
            // out of user input, sample next token
            const float top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;
            const float repeat_penalty = params.repeat_penalty;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = llama_sample_top_p_top_k(vocab, logits.data() + (logits.size() - n_vocab), last_n_tokens, repeat_penalty, top_k, top_p, temp, rng);

                last_n_tokens.erase(last_n_tokens.begin());
                last_n_tokens.push_back(id);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);

            // echo this to console
            input_noecho = false;

            // decrement remaining sampling budget
            --remaining_tokens;
        } else {
            // some user input remains from prompt or interaction, forward it to processing
            while (embd_inp.size() > input_consumed) {
                // fprintf(stderr, "%6d -> '%s'\n", embd_inp[input_consumed], vocab.id_to_token.at(embd_inp[input_consumed]).c_str());

                embd.push_back(embd_inp[input_consumed]);
                last_n_tokens.erase(last_n_tokens.begin());
                last_n_tokens.push_back(embd_inp[input_consumed]);
                ++input_consumed;
                if (embd.size() > params.n_batch) {
                    break;
                }
            }

            // reset color to default if we there is no pending user input
            if (!input_noecho && params.use_color && embd_inp.size() == input_consumed) {
                printf(ANSI_COLOR_RESET);
            }
        }

        // display text
        if (!input_noecho) {
            for (auto id : embd) {
                printf("%s", vocab.id_to_token[id].c_str());
            }
            fflush(stdout);
        }

        // in interactive mode, and not currently processing queued inputs;
        // check if we should prompt the user for more
        if (params.interactive && embd_inp.size() <= input_consumed) {
            // check for reverse prompt
            // if (antiprompt_inp.size() && std::equal(antiprompt_inp.rbegin(), antiprompt_inp.rend(), last_n_tokens.rbegin())) {
            //     // reverse prompt found
            //     is_interacting = true;
            // }
            if (is_interacting) {
                // input_consumed =  0;
                // embd_inp.erase(embd_inp.begin());
                input_consumed = embd_inp.size();
                embd_inp.insert(embd_inp.end(), prompt_inp.begin(), prompt_inp.end());
                

                printf("\n> ");

                // currently being interactive
                bool another_line=true;
                while (another_line) {
                    fflush(stdout);
                    char buf[256] = {0};
                    int n_read;
                    if(params.use_color) printf(ANSI_BOLD ANSI_COLOR_GREEN);
                    if (scanf("%255[^\n]%n%*c", buf, &n_read) <= 0) {
                        // presumable empty line, consume the newline
                        if (scanf("%*c") <= 0) { /*ignore*/ }
                        n_read=0;
                    }
                    if(params.use_color) printf(ANSI_COLOR_RESET);

                    if (n_read > 0 && buf[n_read-1]=='\\') {
                        another_line = true;
                        buf[n_read-1] = '\n';
                        buf[n_read] = 0;
                    } else {
                        another_line = false;
                        buf[n_read] = '\n';
                        buf[n_read+1] = 0;
                    }

                    std::vector<gpt_vocab::id> line_inp = ::llama_tokenize(vocab, buf, false);
                    embd_inp.insert(embd_inp.end(), line_inp.begin(), line_inp.end());
                    embd_inp.insert(embd_inp.end(), response_inp.begin(), response_inp.end());

                    remaining_tokens -= prompt_inp.size() + line_inp.size() + response_inp.size();

                    input_noecho = true; // do not echo this again
                }

                is_interacting = false;
            }
        }

        // end of text token
        if (embd.back() == 2) {
            if (params.interactive) {
                is_interacting = true;
                continue;
            } else {
                printf("\n");
                fprintf(stderr, " [end of text]\n");
                break;
            }
        }
    }

#if defined (_WIN32)
    signal(SIGINT, SIG_DFL);
#endif

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        fprintf(stderr, "\n\n");
        fprintf(stderr, "%s: mem per token = %8zu bytes\n", __func__, mem_per_token);
        fprintf(stderr, "%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        fprintf(stderr, "%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        fprintf(stderr, "%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        fprintf(stderr, "%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx);

    if (params.use_color) {
        printf(ANSI_COLOR_RESET);
    }

    return 0;
}